

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O3

void lzma_index_end(lzma_index *i,lzma_allocator *allocator)

{
  index_tree_node *node;
  
  if (i != (lzma_index *)0x0) {
    node = (i->streams).root;
    if (node != (index_tree_node *)0x0) {
      index_tree_node_end(node,allocator,index_stream_end);
    }
    lzma_free(i,allocator);
    return;
  }
  return;
}

Assistant:

extern LZMA_API(void)
lzma_index_end(lzma_index *i, lzma_allocator *allocator)
{
	// NOTE: If you modify this function, check also the bottom
	// of lzma_index_cat().
	if (i != NULL) {
		index_tree_end(&i->streams, allocator, &index_stream_end);
		lzma_free(i, allocator);
	}

	return;
}